

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesTests.cpp
# Opt level: O2

TestCaseGroup * vkt::sparse::createTests(TestContext *testCtx)

{
  TestCaseGroup *pTVar1;
  TestNode *pTVar2;
  TestNode *node;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> sparseTests;
  
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,testCtx,"sparse_resources","Sparse Resources Tests");
  sparseTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  ptr = (TestCaseGroup *)pTVar2;
  node = &createSparseBufferTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(pTVar2,node);
  pTVar1 = sparseTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
           .m_data.ptr;
  pTVar2 = &createImageSparseBindingTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&pTVar1->super_TestNode,pTVar2);
  pTVar1 = sparseTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
           .m_data.ptr;
  pTVar2 = &createImageSparseResidencyTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&pTVar1->super_TestNode,pTVar2);
  pTVar1 = sparseTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
           .m_data.ptr;
  pTVar2 = &createMipmapSparseResidencyTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&pTVar1->super_TestNode,pTVar2);
  pTVar1 = sparseTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
           .m_data.ptr;
  pTVar2 = &createImageSparseMemoryAliasingTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&pTVar1->super_TestNode,pTVar2);
  pTVar1 = sparseTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
           .m_data.ptr;
  pTVar2 = &createSparseResourcesShaderIntrinsicsTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&pTVar1->super_TestNode,pTVar2);
  pTVar1 = sparseTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
           .m_data.ptr;
  pTVar2 = &createQueueBindSparseTests(testCtx)->super_TestNode;
  tcu::TestNode::addChild(&pTVar1->super_TestNode,pTVar2);
  pTVar1 = sparseTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
           .m_data.ptr;
  sparseTests.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  ptr = (TestCaseGroup *)0x0;
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&sparseTests.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  return pTVar1;
}

Assistant:

tcu::TestCaseGroup* createTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> sparseTests (new tcu::TestCaseGroup(testCtx, "sparse_resources", "Sparse Resources Tests"));

	sparseTests->addChild(createSparseBufferTests					(testCtx));
	sparseTests->addChild(createImageSparseBindingTests				(testCtx));
	sparseTests->addChild(createImageSparseResidencyTests			(testCtx));
	sparseTests->addChild(createMipmapSparseResidencyTests			(testCtx));
	sparseTests->addChild(createImageSparseMemoryAliasingTests		(testCtx));
	sparseTests->addChild(createSparseResourcesShaderIntrinsicsTests(testCtx));
	sparseTests->addChild(createQueueBindSparseTests				(testCtx));

	return sparseTests.release();
}